

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_value_numbering.cpp
# Opt level: O2

string * __thiscall
mocker::LocalValueNumbering::hash_abi_cxx11_
          (string *__return_storage_ptr__,LocalValueNumbering *this,
          shared_ptr<mocker::ir::Addr> *addr)

{
  shared_ptr<mocker::ir::IntLiteral> *psVar1;
  shared_ptr<mocker::ir::Reg> p_1;
  shared_ptr<mocker::ir::IntLiteral> p;
  
  std::dynamic_pointer_cast<mocker::ir::IntLiteral,mocker::ir::Addr>
            ((shared_ptr<mocker::ir::Addr> *)&p);
  if (p.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    ir::dycGlobalReg((shared_ptr<mocker::ir::Addr> *)&p_1);
    if (p_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&p_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      ir::dycLocalReg((shared_ptr<mocker::ir::Addr> *)&p_1);
      if (p_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&p_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/local_value_numbering.cpp"
                      ,0x41,
                      "std::string mocker::LocalValueNumbering::hash(const std::shared_ptr<ir::Addr> &)"
                     );
      }
      std::operator+(__return_storage_ptr__,"local:",
                     &(p_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      identifier);
    }
    else {
      std::operator+(__return_storage_ptr__,"global:",
                     &(p_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      identifier);
    }
    psVar1 = (shared_ptr<mocker::ir::IntLiteral> *)&p_1;
  }
  else {
    std::__cxx11::to_string
              ((string *)&p_1,
               (p.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               val);
    std::operator+(__return_storage_ptr__,"int:",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_1);
    std::__cxx11::string::~string((string *)&p_1);
    psVar1 = &p;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(psVar1->super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::string LocalValueNumbering::hash(const std::shared_ptr<ir::Addr> &addr) {
  if (auto p = ir::dyc<ir::IntLiteral>(addr))
    return "int:" + std::to_string(p->getVal());
  if (auto p = ir::dycGlobalReg(addr))
    return "global:" + p->getIdentifier();
  if (auto p = ir::dycLocalReg(addr))
    return "local:" + p->getIdentifier();
  assert(false);
}